

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O3

void on_link_state_changed(void *context,LINK_STATE new_link_state,LINK_STATE previous_link_state)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  if (new_link_state == LINK_STATE_DETACHED) {
    iVar1 = *(int *)((long)context + 0x18);
    if (iVar1 - 3U < 2) {
      indicate_all_messages_as_error((MESSAGE_SENDER_INSTANCE *)context);
      iVar1 = *(int *)((long)context + 0x18);
      *(undefined4 *)((long)context + 0x18) = 1;
      UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x20);
      if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
        uVar3 = *(undefined8 *)((long)context + 0x28);
        uVar2 = 1;
LAB_00115319:
        (*UNRECOVERED_JUMPTABLE)(uVar3,uVar2,iVar1);
        return;
      }
    }
    else if (iVar1 != 1) {
      *(undefined4 *)((long)context + 0x18) = 5;
      UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x20);
      if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
        uVar3 = *(undefined8 *)((long)context + 0x28);
        uVar2 = 5;
        goto LAB_00115319;
      }
    }
  }
  else if (new_link_state == LINK_STATE_ERROR) {
    if (*(int *)((long)context + 0x18) != 5) {
      indicate_all_messages_as_error((MESSAGE_SENDER_INSTANCE *)context);
      iVar1 = *(int *)((long)context + 0x18);
      *(undefined4 *)((long)context + 0x18) = 5;
      UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x20);
      if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
        uVar3 = *(undefined8 *)((long)context + 0x28);
        uVar2 = 5;
        goto LAB_00115319;
      }
    }
  }
  else if ((new_link_state == LINK_STATE_ATTACHED) && (*(int *)((long)context + 0x18) == 2)) {
    *(undefined4 *)((long)context + 0x18) = 3;
    UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x20);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      uVar3 = *(undefined8 *)((long)context + 0x28);
      uVar2 = 3;
      iVar1 = 2;
      goto LAB_00115319;
    }
  }
  return;
}

Assistant:

static void on_link_state_changed(void* context, LINK_STATE new_link_state, LINK_STATE previous_link_state)
{
    MESSAGE_SENDER_INSTANCE* message_sender = (MESSAGE_SENDER_INSTANCE*)context;
    (void)previous_link_state;

    switch (new_link_state)
    {
    default:
        break;

    case LINK_STATE_ATTACHED:
        if (message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPENING)
        {
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_OPEN);
        }
        break;
    case LINK_STATE_DETACHED:
        if ((message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPEN) ||
            (message_sender->message_sender_state == MESSAGE_SENDER_STATE_CLOSING))
        {
            /* switch to closing so that no more requests should be accepted */
            indicate_all_messages_as_error(message_sender);
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_IDLE);
        }
        else if (message_sender->message_sender_state != MESSAGE_SENDER_STATE_IDLE)
        {
            /* Any other transition must be an error */
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_ERROR);
        }
        break;
    case LINK_STATE_ERROR:
        if (message_sender->message_sender_state != MESSAGE_SENDER_STATE_ERROR)
        {
            indicate_all_messages_as_error(message_sender);
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_ERROR);
        }
        break;
    }
}